

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<kj::CompressionParameters> * __thiscall
kj::ArrayBuilder<kj::CompressionParameters>::operator=
          (ArrayBuilder<kj::CompressionParameters> *this,
          ArrayBuilder<kj::CompressionParameters> *other)

{
  CompressionParameters *pCVar1;
  RemoveConst<kj::CompressionParameters> *pRVar2;
  CompressionParameters *pCVar3;
  ArrayDisposer *pAVar4;
  
  pCVar1 = this->ptr;
  if (pCVar1 != (CompressionParameters *)0x0) {
    pRVar2 = this->pos;
    pCVar3 = this->endPtr;
    this->ptr = (CompressionParameters *)0x0;
    this->pos = (RemoveConst<kj::CompressionParameters> *)0x0;
    this->endPtr = (CompressionParameters *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pCVar1,0x28,((long)pRVar2 - (long)pCVar1 >> 3) * -0x3333333333333333,
               ((long)pCVar3 - (long)pCVar1 >> 3) * -0x3333333333333333,
               ArrayDisposer::Dispose_<kj::CompressionParameters>::destruct);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (CompressionParameters *)0x0;
  other->pos = (RemoveConst<kj::CompressionParameters> *)0x0;
  other->endPtr = (CompressionParameters *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }